

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O1

void start_pass(j_decompress_ptr cinfo)

{
  double dVar1;
  jpeg_inverse_dct *pjVar2;
  JQUANT_TBL *pJVar3;
  void *pvVar4;
  inverse_DCT_method_ptr p_Var5;
  code *pcVar6;
  jpeg_error_mgr *pjVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  long lVar12;
  long lVar13;
  int row;
  long lVar14;
  long lVar15;
  jpeg_component_info *pjVar16;
  
  if (0 < cinfo->num_components) {
    pjVar16 = cinfo->comp_info;
    pjVar2 = cinfo->idct;
    lVar15 = 0;
    p_Var5 = (inverse_DCT_method_ptr)0x0;
    uVar9 = 0;
    do {
      iVar8 = pjVar16->DCT_h_scaled_size;
      iVar11 = iVar8 * 0x100 + pjVar16->DCT_v_scaled_size;
      if (iVar11 < 0x70e) {
        if (0x403 < iVar11) {
          if (iVar11 < 0x603) {
            if (iVar11 < 0x505) {
              if (iVar11 == 0x404) {
                pcVar6 = jpeg_idct_4x4;
              }
              else {
                if (iVar11 != 0x408) goto LAB_002841a5;
                pcVar6 = jpeg_idct_4x8;
              }
            }
            else if (iVar11 == 0x505) {
              pcVar6 = jpeg_idct_5x5;
            }
            else {
              if (iVar11 != 0x50a) goto LAB_002841a5;
              pcVar6 = jpeg_idct_5x10;
            }
          }
          else if (iVar11 < 0x60c) {
            if (iVar11 == 0x603) {
              pcVar6 = jpeg_idct_6x3;
            }
            else {
              if (iVar11 != 0x606) goto LAB_002841a5;
              pcVar6 = jpeg_idct_6x6;
            }
          }
          else if (iVar11 == 0x60c) {
            pcVar6 = jpeg_idct_6x12;
          }
          else {
            if (iVar11 != 0x707) goto LAB_002841a5;
            pcVar6 = jpeg_idct_7x7;
          }
          goto LAB_002840b0;
        }
        if (0x203 < iVar11) {
          if (iVar11 < 0x306) {
            if (iVar11 == 0x204) {
              pcVar6 = jpeg_idct_2x4;
            }
            else {
              if (iVar11 != 0x303) goto LAB_002841a5;
              pcVar6 = jpeg_idct_3x3;
            }
          }
          else if (iVar11 == 0x306) {
            pcVar6 = jpeg_idct_3x6;
          }
          else {
            if (iVar11 != 0x402) goto LAB_002841a5;
            pcVar6 = jpeg_idct_4x2;
          }
          goto LAB_002840b0;
        }
        if (0x200 < iVar11) {
          if (iVar11 == 0x201) {
            pcVar6 = jpeg_idct_2x1;
          }
          else {
            if (iVar11 != 0x202) goto LAB_002841a5;
            pcVar6 = jpeg_idct_2x2;
          }
          goto LAB_002840b0;
        }
        pcVar6 = jpeg_idct_1x1;
        uVar10 = 0;
        if (iVar11 != 0x101) {
          if (iVar11 != 0x102) {
LAB_002841a5:
            pjVar7 = cinfo->err;
            pjVar7->msg_code = 7;
            (pjVar7->msg_parm).i[0] = iVar8;
            (cinfo->err->msg_parm).i[1] = pjVar16->DCT_v_scaled_size;
            pjVar7 = cinfo->err;
            goto LAB_002841cb;
          }
          pcVar6 = jpeg_idct_1x2;
          goto LAB_002840b0;
        }
      }
      else {
        if (iVar11 < 0xc06) {
          if (iVar11 < 0x909) {
            if (iVar11 < 0x808) {
              if (iVar11 == 0x70e) {
                pcVar6 = jpeg_idct_7x14;
              }
              else {
                if (iVar11 != 0x804) goto LAB_002841a5;
                pcVar6 = jpeg_idct_8x4;
              }
            }
            else {
              if (iVar11 == 0x808) {
                uVar10 = (ulong)cinfo->dct_method;
                if (uVar10 < 3) {
                  pcVar6 = (code *)(&PTR_jpeg_idct_islow_003b44e0)[uVar10];
                  goto LAB_002840b2;
                }
                pjVar7 = cinfo->err;
                pjVar7->msg_code = 0x31;
LAB_002841cb:
                (*pjVar7->error_exit)((j_common_ptr)cinfo);
                pcVar6 = p_Var5;
                uVar10 = uVar9;
                goto LAB_002840b2;
              }
              if (iVar11 != 0x810) goto LAB_002841a5;
              pcVar6 = jpeg_idct_8x16;
            }
          }
          else if (iVar11 < 0xa0a) {
            if (iVar11 == 0x909) {
              pcVar6 = jpeg_idct_9x9;
            }
            else {
              if (iVar11 != 0xa05) goto LAB_002841a5;
              pcVar6 = jpeg_idct_10x5;
            }
          }
          else if (iVar11 == 0xa0a) {
            pcVar6 = jpeg_idct_10x10;
          }
          else {
            if (iVar11 != 0xb0b) goto LAB_002841a5;
            pcVar6 = jpeg_idct_11x11;
          }
        }
        else if (iVar11 < 0xe0e) {
          if (iVar11 < 0xd0d) {
            if (iVar11 == 0xc06) {
              pcVar6 = jpeg_idct_12x6;
            }
            else {
              if (iVar11 != 0xc0c) goto LAB_002841a5;
              pcVar6 = jpeg_idct_12x12;
            }
          }
          else if (iVar11 == 0xd0d) {
            pcVar6 = jpeg_idct_13x13;
          }
          else {
            if (iVar11 != 0xe07) goto LAB_002841a5;
            pcVar6 = jpeg_idct_14x7;
          }
        }
        else if (iVar11 < 0x1008) {
          if (iVar11 == 0xe0e) {
            pcVar6 = jpeg_idct_14x14;
          }
          else {
            if (iVar11 != 0xf0f) goto LAB_002841a5;
            pcVar6 = jpeg_idct_15x15;
          }
        }
        else if (iVar11 == 0x1008) {
          pcVar6 = jpeg_idct_16x8;
        }
        else {
          if (iVar11 != 0x1010) goto LAB_002841a5;
          pcVar6 = jpeg_idct_16x16;
        }
LAB_002840b0:
        uVar10 = 0;
      }
LAB_002840b2:
      pjVar2->inverse_DCT[lVar15] = pcVar6;
      if (((pjVar16->component_needed != 0) &&
          (iVar8 = (int)uVar10, *(int *)((long)pjVar2[1].inverse_DCT + lVar15 * 4 + -8) != iVar8))
         && (pJVar3 = pjVar16->quant_table, pJVar3 != (JQUANT_TBL *)0x0)) {
        *(int *)((long)pjVar2[1].inverse_DCT + lVar15 * 4 + -8) = iVar8;
        pvVar4 = pjVar16->dct_table;
        if (iVar8 == 0) {
          lVar13 = 0;
          do {
            *(uint *)((long)pvVar4 + lVar13 * 4) = (uint)pJVar3->quantval[lVar13];
            lVar13 = lVar13 + 1;
          } while (lVar13 != 0x40);
        }
        else if (iVar8 == 1) {
          lVar13 = 0;
          do {
            *(int *)((long)pvVar4 + lVar13 * 2) =
                 (int)((long)*(short *)((long)start_pass::aanscales + lVar13) *
                       (ulong)*(ushort *)((long)pJVar3->quantval + lVar13) + 0x800 >> 0xc);
            lVar13 = lVar13 + 2;
          } while (lVar13 != 0x80);
        }
        else {
          lVar14 = 0;
          lVar13 = 0;
          do {
            dVar1 = start_pass::aanscalefactor[lVar14];
            lVar13 = (long)(int)lVar13;
            lVar12 = 0;
            do {
              *(float *)((long)pvVar4 + lVar13 * 4) =
                   (float)((double)pJVar3->quantval[lVar13] * dVar1 *
                           *(double *)((long)start_pass::aanscalefactor + lVar12) * 0.125);
              lVar13 = lVar13 + 1;
              lVar12 = lVar12 + 8;
            } while (lVar12 != 0x40);
            lVar14 = lVar14 + 1;
          } while (lVar14 != 8);
        }
      }
      lVar15 = lVar15 + 1;
      pjVar16 = pjVar16 + 1;
      p_Var5 = pcVar6;
      uVar9 = uVar10;
    } while (lVar15 < cinfo->num_components);
  }
  return;
}

Assistant:

METHODDEF(void)
start_pass (j_decompress_ptr cinfo)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  int ci, tbl;
  jpeg_component_info * compptr;

  if (cinfo->progressive_mode) {
    /* Validate progressive scan parameters */
    if (cinfo->Ss == 0) {
      if (cinfo->Se != 0)
	goto bad;
    } else {
      /* need not check Ss/Se < 0 since they came from unsigned bytes */
      if (cinfo->Se < cinfo->Ss || cinfo->Se > cinfo->lim_Se)
	goto bad;
      /* AC scans may have only one component */
      if (cinfo->comps_in_scan != 1)
	goto bad;
    }
    if (cinfo->Ah != 0) {
      /* Successive approximation refinement scan: must have Al = Ah-1. */
      if (cinfo->Ah-1 != cinfo->Al)
	goto bad;
    }
    if (cinfo->Al > 13) {	/* need not check for < 0 */
      bad:
      ERREXIT4(cinfo, JERR_BAD_PROGRESSION,
	       cinfo->Ss, cinfo->Se, cinfo->Ah, cinfo->Al);
    }
    /* Update progression status, and verify that scan order is legal.
     * Note that inter-scan inconsistencies are treated as warnings
     * not fatal errors ... not clear if this is right way to behave.
     */
    for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
      int coefi, cindex = cinfo->cur_comp_info[ci]->component_index;
      int *coef_bit_ptr = & cinfo->coef_bits[cindex][0];
      if (cinfo->Ss && coef_bit_ptr[0] < 0) /* AC without prior DC scan */
	WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, 0);
      for (coefi = cinfo->Ss; coefi <= cinfo->Se; coefi++) {
	int expected = (coef_bit_ptr[coefi] < 0) ? 0 : coef_bit_ptr[coefi];
	if (cinfo->Ah != expected)
	  WARNMS2(cinfo, JWRN_BOGUS_PROGRESSION, cindex, coefi);
	coef_bit_ptr[coefi] = cinfo->Al;
      }
    }
    /* Select MCU decoding routine */
    if (cinfo->Ah == 0) {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_first;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_first;
    } else {
      if (cinfo->Ss == 0)
	entropy->pub.decode_mcu = decode_mcu_DC_refine;
      else
	entropy->pub.decode_mcu = decode_mcu_AC_refine;
    }
  } else {
    /* Check that the scan parameters Ss, Se, Ah/Al are OK for sequential JPEG.
     * This ought to be an error condition, but we make it a warning.
     */
    if (cinfo->Ss != 0 || cinfo->Ah != 0 || cinfo->Al != 0 ||
	(cinfo->Se < DCTSIZE2 && cinfo->Se != cinfo->lim_Se))
      WARNMS(cinfo, JWRN_NOT_SEQUENTIAL);
    /* Select MCU decoding routine */
    entropy->pub.decode_mcu = decode_mcu;
  }

  /* Allocate & initialize requested statistics areas */
  for (ci = 0; ci < cinfo->comps_in_scan; ci++) {
    compptr = cinfo->cur_comp_info[ci];
    if (! cinfo->progressive_mode || (cinfo->Ss == 0 && cinfo->Ah == 0)) {
      tbl = compptr->dc_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->dc_stats[tbl] == NULL)
	entropy->dc_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, DC_STAT_BINS);
      MEMZERO(entropy->dc_stats[tbl], DC_STAT_BINS);
      /* Initialize DC predictions to 0 */
      entropy->last_dc_val[ci] = 0;
      entropy->dc_context[ci] = 0;
    }
    if ((! cinfo->progressive_mode && cinfo->lim_Se) ||
	(cinfo->progressive_mode && cinfo->Ss)) {
      tbl = compptr->ac_tbl_no;
      if (tbl < 0 || tbl >= NUM_ARITH_TBLS)
	ERREXIT1(cinfo, JERR_NO_ARITH_TABLE, tbl);
      if (entropy->ac_stats[tbl] == NULL)
	entropy->ac_stats[tbl] = (unsigned char *) (*cinfo->mem->alloc_small)
	  ((j_common_ptr) cinfo, JPOOL_IMAGE, AC_STAT_BINS);
      MEMZERO(entropy->ac_stats[tbl], AC_STAT_BINS);
    }
  }

  /* Initialize arithmetic decoding variables */
  entropy->c = 0;
  entropy->a = 0;
  entropy->ct = -16;	/* force reading 2 initial bytes to fill C */

  /* Initialize restart counter */
  entropy->restarts_to_go = cinfo->restart_interval;
}